

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O0

void __thiscall Markov::Connection::TrainFull(Connection *this,string_view src,TrainData *td)

{
  char **ppcVar1;
  csub_match m;
  bool bVar2;
  const_iterator __a;
  const_iterator __b;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *__re;
  value_type *pvVar3;
  string_view sVar4;
  undefined8 in_stack_fffffffffffffe40;
  regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> local_170;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  string_view local_d0;
  undefined1 local_b0 [8];
  sviterator iter;
  TrainData *td_local;
  Connection *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Connection *)src._M_len;
  iter._128_8_ = td;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&td->sep);
  if (bVar2) {
    __a = std::basic_string_view<char,_std::char_traits<char>_>::begin
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __b = std::basic_string_view<char,_std::char_traits<char>_>::end
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    __re = std::optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::
           operator*((optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>
                      *)(iter._128_8_ + 0x20));
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    regex_token_iterator
              ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
               local_b0,__a,__b,__re,-1,0);
    while( true ) {
      bVar2 = std::__cxx11::
              regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
              operator!=((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_b0,
                         (regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                          *)(iter._128_8_ + 0x108));
      if (!bVar2) break;
      pvVar3 = std::__cxx11::
               regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
               operator*((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_b0);
      local_d8 = *(undefined8 *)&pvVar3->matched;
      local_e8 = (pvVar3->super_pair<const_char_*,_const_char_*>).first;
      ppcVar1 = &(pvVar3->super_pair<const_char_*,_const_char_*>).second;
      pcStack_e0 = *ppcVar1;
      m._16_8_ = in_stack_fffffffffffffe40;
      m.super_pair<const_char_*,_const_char_*> = *(pair<const_char_*,_const_char_*> *)ppcVar1;
      sVar4 = anon_unknown.dwarf_22748::matchToSv(m);
      local_d0 = sVar4;
      TrainPart(this,sVar4,(TrainData *)iter._128_8_);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      operator++(&local_170,
                 (regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                 local_b0,0);
      std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
      ~regex_token_iterator(&local_170);
    }
    std::__cxx11::regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_token_iterator
              ((regex_token_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
               local_b0);
  }
  else {
    sVar4._M_str = (char *)src_local._M_len;
    sVar4._M_len = (size_t)this_local;
    TrainPart(this,sVar4,(TrainData *)iter._128_8_);
  }
  return;
}

Assistant:

void Connection::TrainFull(std::string_view src, const TrainData& td) {
		if (td.sep) {
				for (auto iter = sviterator(src.begin(), src.end(), *td.sep, -1); iter != td.badIter; iter++) {
						TrainPart(matchToSv(*iter), td);
						}
				}
		else {
				TrainPart(src, td);
				}
		}